

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_utils.hpp
# Opt level: O1

String * __thiscall
Args::eatOneValue<Args::CmdLine,Args::Context>
          (String *__return_storage_ptr__,Args *this,Context *context,String *errorDescription,
          CmdLine *cmdLine)

{
  String *name;
  pointer pcVar1;
  pointer pbVar2;
  ArgIface *pAVar3;
  logic_error *this_00;
  uint *local_50;
  undefined8 local_48;
  uint local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  name = *(String **)(this + 0x18);
  if (name != *(String **)(this + 8)) {
    *(String **)(this + 0x18) = name + 1;
    pAVar3 = CmdLine::findArgument((CmdLine *)errorDescription,name);
    if (pAVar3 == (ArgIface *)0x0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar1 = (name->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar1,pcVar1 + name->_M_string_length);
    }
    else if (*(long *)(this + 0x18) != *(long *)this) {
      *(long *)(this + 0x18) = *(long *)(this + 0x18) + -0x20;
    }
    if (pAVar3 == (ArgIface *)0x0) {
      return __return_storage_ptr__;
    }
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x30);
  pbVar2 = (context->m_context).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_50 = &local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pbVar2,
             (long)&(((context->m_context).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)._M_p + (long)pbVar2)
  ;
  std::logic_error::logic_error(this_00,"Please use desc() method of the exception.");
  *(undefined ***)this_00 = &PTR__BaseException_00133c60;
  *(logic_error **)(this_00 + 0x10) = this_00 + 0x20;
  if (local_50 == &local_40) {
    *(uint *)(this_00 + 0x20) = local_40;
    *(undefined4 *)(this_00 + 0x24) = uStack_3c;
    *(undefined4 *)(this_00 + 0x28) = uStack_38;
    *(undefined4 *)(this_00 + 0x2c) = uStack_34;
  }
  else {
    *(uint **)(this_00 + 0x10) = local_50;
    *(ulong *)(this_00 + 0x20) = CONCAT44(uStack_3c,local_40);
  }
  *(undefined8 *)(this_00 + 0x18) = local_48;
  local_48 = 0;
  local_40 = local_40 & 0xffffff00;
  local_50 = &local_40;
  __cxa_throw(this_00,&BaseException::typeinfo,BaseException::~BaseException);
}

Assistant:

String eatOneValue( Ctx & context,
	const String & errorDescription, Cmd * cmdLine )
{
	if( !context.atEnd() )
	{
		auto val = context.next();

		if( !cmdLine->findArgument( *val ) )
			return *val;

		context.putBack();
	}

	throw BaseException( errorDescription );
}